

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall
CTxMemPool::UpdateEntryForAncestors(CTxMemPool *this,txiter it,setEntries *setAncestors)

{
  size_type *psVar1;
  long lVar2;
  size_t modifyCount;
  long lVar3;
  bool bVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  CAmount modifyFee;
  int64_t modifySigOps;
  int modifySize;
  _Rb_tree_header *p_Var7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var6 = (setAncestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  modifyCount = (setAncestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  p_Var7 = &(setAncestors->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 == p_Var7) {
    modifySigOps = 0;
    modifyFee = 0;
    modifySize = 0;
  }
  else {
    modifySize = 0;
    modifyFee = 0;
    modifySigOps = 0;
    do {
      lVar3 = *(long *)(p_Var6 + 1);
      iVar5 = GetVirtualTransactionSize
                        ((long)*(int *)(lVar3 + 0x78),*(int64_t *)(lVar3 + 0xa0),nBytesPerSigOp);
      modifySize = modifySize + (int)iVar5;
      modifyFee = modifyFee + *(long *)(lVar3 + 0xa8);
      modifySigOps = modifySigOps + *(long *)(lVar3 + 0xa0);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  CTxMemPoolEntry::UpdateAncestorState
            ((CTxMemPoolEntry *)it.node,modifySize,modifyFee,modifyCount,modifySigOps);
  bVar4 = boost::multi_index::detail::
          hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          ::modify_(&(this->mapTx).super_type,it.node);
  if (!bVar4) {
    std::
    allocator_traits<std::allocator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_>_>
    ::destroy<CTxMemPoolEntry>((allocator_type *)&this->mapTx,(CTxMemPoolEntry *)it.node);
    operator_delete(it.node,0x178);
    psVar1 = &(this->mapTx).node_count;
    *psVar1 = *psVar1 - 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::UpdateEntryForAncestors(txiter it, const setEntries &setAncestors)
{
    int64_t updateCount = setAncestors.size();
    int64_t updateSize = 0;
    CAmount updateFee = 0;
    int64_t updateSigOpsCost = 0;
    for (txiter ancestorIt : setAncestors) {
        updateSize += ancestorIt->GetTxSize();
        updateFee += ancestorIt->GetModifiedFee();
        updateSigOpsCost += ancestorIt->GetSigOpCost();
    }
    mapTx.modify(it, [=](CTxMemPoolEntry& e){ e.UpdateAncestorState(updateSize, updateFee, updateCount, updateSigOpsCost); });
}